

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsvectorbase.h
# Opt level: O0

void __thiscall
soplex::
DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setMax(DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this,int newmax)

{
  int s;
  int iVar1;
  int iVar2;
  int in_ESI;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  int in_stack_0000000c;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  **in_stack_00000010;
  int i;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *newmem;
  int len;
  int siz;
  int iVar3;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  
  s = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::size((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)((in_RDI->val).m_backend.data._M_elems + 2));
  if (in_ESI < s) {
    in_ESI = s;
  }
  iVar2 = in_ESI;
  iVar3 = in_ESI;
  iVar1 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::max((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((in_RDI->val).m_backend.data._M_elems + 2));
  if (iVar2 != iVar1) {
    this_00 = (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x0;
    spx_alloc<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>*>
              (in_stack_00000010,in_stack_0000000c);
    for (iVar1 = 0; iVar1 < s; iVar1 = iVar1 + 1) {
      Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Nonzero(in_RDI,(Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(iVar3,iVar2));
    }
    for (; iVar1 < in_ESI; iVar1 = iVar1 + 1) {
      Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Nonzero((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(iVar3,iVar2));
    }
    iVar2 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::max((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((in_RDI->val).m_backend.data._M_elems + 2));
    do {
      iVar2 = iVar2 + -1;
    } while (-1 < iVar2);
    if (*(long *)((in_RDI->val).m_backend.data._M_elems + 6) != 0) {
      spx_free<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>*>
                ((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  **)0x320a2e);
    }
    *(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      **)((in_RDI->val).m_backend.data._M_elems + 6) = this_00;
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setMem(this_00,iVar2,in_RDI);
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::set_size((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)((in_RDI->val).m_backend.data._M_elems + 2),s);
  }
  return;
}

Assistant:

void setMax(int newmax = 1)
   {
      int siz = SVectorBase<R>::size();
      int len = (newmax < siz) ? siz : newmax;

      if(len == SVectorBase<R>::max())
         return;

      Nonzero<R>* newmem = nullptr;

      /* allocate new memory */
      spx_alloc(newmem, len);

      /* call copy constructor for first elements */
      int i;

      for(i = 0; i < siz; i++)
         new((&newmem[i])) Nonzero<R>(theelem[i]);

      /* call default constructor for remaining elements */
      for(; i < len; i++)
         new((&newmem[i])) Nonzero<R>();

      /* free old memory */
      for(i = SVectorBase<R>::max() - 1; i >= 0; i--)
         theelem[i].~Nonzero<R>();

      if(theelem != nullptr)
         spx_free(theelem);

      /* assign new memory */
      theelem = newmem;
      SVectorBase<R>::setMem(len, theelem);
      SVectorBase<R>::set_size(siz);
   }